

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::ShortByteData<tcu::Vector<int,_4>_>::ShortByteData
          (ShortByteData<tcu::Vector<int,_4>_> *this,int size,Vector<int,_4> *value,
          GLenum internalformat,GLenum format)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int *piVar5;
  reference pvVar6;
  reference pvVar7;
  uint local_4c;
  uint local_48;
  uint i_2;
  uint i_1;
  uint i;
  allocator<tcu::Vector<int,_4>_> local_29;
  GLenum local_28;
  GLenum local_24;
  GLenum format_local;
  GLenum internalformat_local;
  Vector<int,_4> *value_local;
  ShortByteData<tcu::Vector<int,_4>_> *pSStack_10;
  int size_local;
  ShortByteData<tcu::Vector<int,_4>_> *this_local;
  
  local_28 = format;
  local_24 = internalformat;
  _format_local = value;
  value_local._4_4_ = size;
  pSStack_10 = this;
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_29);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&this->data,(long)(size * size),value,&local_29);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_29);
  iVar2 = value_local._4_4_ * value_local._4_4_;
  std::allocator<short>::allocator((allocator<short> *)((long)&i_1 + 3));
  std::vector<short,_std::allocator<short>_>::vector
            (&this->datas,(long)(iVar2 * 4),(allocator<short> *)((long)&i_1 + 3));
  std::allocator<short>::~allocator((allocator<short> *)((long)&i_1 + 3));
  iVar2 = value_local._4_4_ * value_local._4_4_;
  std::allocator<signed_char>::allocator((allocator<signed_char> *)((long)&i_1 + 2));
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&this->datab,(long)(iVar2 * 4),(allocator<signed_char> *)((long)&i_1 + 2));
  std::allocator<signed_char>::~allocator((allocator<signed_char> *)((long)&i_1 + 2));
  iVar2 = Components(local_28);
  if (iVar2 == 1) {
    for (i_2 = 0; sVar3 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                          size(&this->data), (ulong)i_2 < sVar3 >> 2; i_2 = i_2 + 1) {
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(i_2 << 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      iVar2 = *piVar5;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)i_2);
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      *piVar5 = iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(i_2 * 4 + 1));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      iVar2 = *piVar5;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)i_2);
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,1);
      *piVar5 = iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(i_2 * 4 + 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      iVar2 = *piVar5;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)i_2);
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,2);
      *piVar5 = iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(i_2 * 4 + 3));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      iVar2 = *piVar5;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)i_2);
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,3);
      *piVar5 = iVar2;
    }
  }
  bVar1 = Shorts(local_24);
  if (bVar1) {
    for (local_48 = 0; sVar3 = std::vector<short,_std::allocator<short>_>::size(&this->datas),
        local_48 < sVar3; local_48 = local_48 + 4) {
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(local_48 >> 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
      iVar2 = *piVar5;
      pvVar6 = std::vector<short,_std::allocator<short>_>::operator[](&this->datas,(ulong)local_48);
      *pvVar6 = (value_type)iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(local_48 >> 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,1);
      iVar2 = *piVar5;
      pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                         (&this->datas,(ulong)(local_48 + 1));
      *pvVar6 = (value_type)iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(local_48 >> 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,2);
      iVar2 = *piVar5;
      pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                         (&this->datas,(ulong)(local_48 + 2));
      *pvVar6 = (value_type)iVar2;
      pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         (&this->data,(ulong)(local_48 >> 2));
      piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,3);
      iVar2 = *piVar5;
      pvVar6 = std::vector<short,_std::allocator<short>_>::operator[]
                         (&this->datas,(ulong)(local_48 + 3));
      *pvVar6 = (value_type)iVar2;
    }
  }
  bVar1 = Bytes(local_24);
  if (bVar1) {
    for (local_4c = 0; sVar3 = std::vector<short,_std::allocator<short>_>::size(&this->datas),
        local_4c < sVar3; local_4c = local_4c + 4) {
      if ((local_24 == 0x8d8e) || (local_24 == 0x8d7c)) {
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)local_4c);
        *pvVar7 = (value_type)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,1);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 1));
        *pvVar7 = (value_type)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,2);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 2));
        *pvVar7 = (value_type)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,3);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 3));
        *pvVar7 = (value_type)iVar2;
      }
      else if (local_24 == 0x8058) {
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)local_4c);
        *pvVar7 = -(char)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,1);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 1));
        *pvVar7 = -(char)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,2);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 2));
        *pvVar7 = -(char)iVar2;
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,3);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 3));
        *pvVar7 = -(char)iVar2;
      }
      else {
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,0);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)local_4c);
        *pvVar7 = (char)iVar2 * '\x7f';
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,1);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 1));
        *pvVar7 = (char)iVar2 * '\x7f';
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,2);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 2));
        *pvVar7 = (char)iVar2 * '\x7f';
        pvVar4 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                           (&this->data,(ulong)(local_4c >> 2));
        piVar5 = tcu::Vector<int,_4>::operator[](pvVar4,3);
        iVar2 = *piVar5;
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->datab,(ulong)(local_4c + 3));
        *pvVar7 = (char)iVar2 * '\x7f';
      }
    }
  }
  return;
}

Assistant:

ShortByteData(int size, const T& value, GLenum internalformat, GLenum format)
		: data(size * size, value), datas(size * size * 4), datab(size * size * 4)
	{
		if (Components(format) == 1)
			for (unsigned i = 0; i < data.size() / 4; ++i)
			{
				data[i][0] = data[i * 4][0];
				data[i][1] = data[i * 4 + 1][0];
				data[i][2] = data[i * 4 + 2][0];
				data[i][3] = data[i * 4 + 3][0];
			}
		if (Shorts(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				datas[i]	 = static_cast<GLshort>(data[i / 4][0]);
				datas[i + 1] = static_cast<GLshort>(data[i / 4][1]);
				datas[i + 2] = static_cast<GLshort>(data[i / 4][2]);
				datas[i + 3] = static_cast<GLshort>(data[i / 4][3]);
			}
		}
		if (Bytes(internalformat))
		{
			for (unsigned i = 0; i < datas.size(); i += 4)
			{
				if (internalformat == GL_RGBA8I || internalformat == GL_RGBA8UI)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0]);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1]);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2]);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3]);
				}
				else if (internalformat == GL_RGBA8)
				{
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 255);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 255);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 255);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 255);
				}
				else
				{ // GL_RGBA8_SNORM
					datab[i]	 = static_cast<GLbyte>(data[i / 4][0] * 127);
					datab[i + 1] = static_cast<GLbyte>(data[i / 4][1] * 127);
					datab[i + 2] = static_cast<GLbyte>(data[i / 4][2] * 127);
					datab[i + 3] = static_cast<GLbyte>(data[i / 4][3] * 127);
				}
			}
		}
	}